

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Type> *
wasm::WATParser::elemlist<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,bool legacy)

{
  bool bVar1;
  Type *pTVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_219;
  string local_218;
  Err local_1f8;
  Err local_1d0;
  Err *local_1b0;
  Err *err_2;
  MaybeResult<wasm::Ok> _val_2;
  MaybeResult<wasm::Ok> func;
  Type res_1;
  Err local_138;
  Err *local_118;
  Err *err_1;
  MaybeResult<wasm::Ok> _val_1;
  MaybeResult<wasm::Ok> elem;
  Type local_b8;
  Type res;
  Err local_a8;
  Err *local_88;
  Err *err;
  undefined1 local_70 [8];
  MaybeResult<wasm::Type> _val;
  MaybeResult<wasm::Type> type;
  bool legacy_local;
  ParseModuleTypesCtx *ctx_local;
  
  maybeReftype<wasm::WATParser::ParseModuleTypesCtx>
            ((MaybeResult<wasm::Type> *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),ctx);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
  if (bVar1) {
    MaybeResult<wasm::Type>::MaybeResult
              ((MaybeResult<wasm::Type> *)local_70,
               (MaybeResult<wasm::Type> *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    local_88 = MaybeResult<wasm::Type>::getErr((MaybeResult<wasm::Type> *)local_70);
    res.id._4_1_ = local_88 != (Err *)0x0;
    if (res.id._4_1_) {
      wasm::Err::Err(&local_a8,local_88);
      Result<wasm::Type>::Result(__return_storage_ptr__,&local_a8);
      wasm::Err::~Err(&local_a8);
    }
    res.id._5_3_ = 0;
    MaybeResult<wasm::Type>::~MaybeResult((MaybeResult<wasm::Type> *)local_70);
    if (res.id._4_4_ == 0) {
      pTVar2 = MaybeResult<wasm::Type>::operator*
                         ((MaybeResult<wasm::Type> *)
                          ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20))
      ;
      local_b8 = ParseModuleTypesCtx::makeElemList(ctx,pTVar2->id);
      do {
        maybeElemexpr<wasm::WATParser::ParseModuleTypesCtx>
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
        bVar1 = wasm::MaybeResult::operator_cast_to_bool
                          ((MaybeResult *)
                           ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        if (bVar1) {
          MaybeResult<wasm::Ok>::MaybeResult
                    ((MaybeResult<wasm::Ok> *)&err_1,
                     (MaybeResult<wasm::Ok> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          local_118 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_1);
          bVar1 = local_118 != (Err *)0x0;
          if (bVar1) {
            wasm::Err::Err(&local_138,local_118);
            Result<wasm::Type>::Result(__return_storage_ptr__,&local_138);
            wasm::Err::~Err(&local_138);
          }
          res.id._5_3_ = 0;
          res.id._4_1_ = bVar1;
          MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_1);
          if (res.id._4_4_ == 0) {
            MaybeResult<wasm::Ok>::operator*
                      ((MaybeResult<wasm::Ok> *)
                       ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            ParseModuleTypesCtx::appendElem(ctx,&local_b8);
            res.id._4_4_ = 0;
          }
        }
        else {
          res.id._4_4_ = 3;
        }
        MaybeResult<wasm::Ok>::~MaybeResult
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      } while (res.id._4_4_ == 0);
      if (res.id._4_4_ == 3) {
        Result<wasm::Type>::Result<wasm::Type>(__return_storage_ptr__,&local_b8);
        res.id._4_4_ = 1;
      }
    }
  }
  else {
    expected = sv("func",4);
    bVar1 = Lexer::takeKeyword(&ctx->in,expected);
    if ((bVar1) || (legacy)) {
      func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ =
           ParseModuleTypesCtx::makeFuncElemList(ctx);
      do {
        maybeFuncidx<wasm::WATParser::ParseModuleTypesCtx>
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
        bVar1 = wasm::MaybeResult::operator_cast_to_bool
                          ((MaybeResult *)
                           ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        if (bVar1) {
          MaybeResult<wasm::Ok>::MaybeResult
                    ((MaybeResult<wasm::Ok> *)&err_2,
                     (MaybeResult<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          local_1b0 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_2);
          bVar1 = local_1b0 != (Err *)0x0;
          if (bVar1) {
            wasm::Err::Err(&local_1d0,local_1b0);
            Result<wasm::Type>::Result(__return_storage_ptr__,&local_1d0);
            wasm::Err::~Err(&local_1d0);
          }
          res.id._5_3_ = 0;
          res.id._4_1_ = bVar1;
          MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_2);
          if (res.id._4_4_ == 0) {
            MaybeResult<wasm::Ok>::operator*
                      ((MaybeResult<wasm::Ok> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            ParseModuleTypesCtx::appendFuncElem
                      (ctx,(__index_type *)
                           ((long)&func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            res.id._4_4_ = 0;
          }
        }
        else {
          res.id._4_4_ = 5;
        }
        MaybeResult<wasm::Ok>::~MaybeResult
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      } while (res.id._4_4_ == 0);
      if (res.id._4_4_ == 5) {
        Result<wasm::Type>::Result<wasm::Type>
                  (__return_storage_ptr__,
                   (Type *)((long)&func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        res.id._4_4_ = 1;
      }
    }
    else {
      res.id._4_4_ = 0;
    }
  }
  MaybeResult<wasm::Type>::~MaybeResult
            ((MaybeResult<wasm::Type> *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
  if (res.id._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"expected element list",&local_219);
    Lexer::err(&local_1f8,&ctx->in,&local_218);
    Result<wasm::Type>::Result(__return_storage_ptr__,&local_1f8);
    wasm::Err::~Err(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::ElemListT> elemlist(Ctx& ctx, bool legacy) {
  if (auto type = maybeReftype(ctx)) {
    CHECK_ERR(type);
    auto res = ctx.makeElemList(*type);
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(res, *elem);
    }
    return res;
  } else if (ctx.in.takeKeyword("func"sv) || legacy) {
    auto res = ctx.makeFuncElemList();
    while (auto func = maybeFuncidx(ctx)) {
      CHECK_ERR(func);
      ctx.appendFuncElem(res, *func);
    }
    return res;
  }
  return ctx.in.err("expected element list");
}